

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiguresTests.cpp
# Opt level: O0

void __thiscall agge::tests::RoundedRectangleTests::AllowsIteration(RoundedRectangleTests *this)

{
  bool value;
  allocator local_219;
  string local_218 [32];
  LocationInfo local_1f8;
  int local_1cc [2];
  allocator local_1c1;
  string local_1c0 [32];
  LocationInfo local_1a0;
  int local_174 [2];
  allocator local_169;
  string local_168 [32];
  LocationInfo local_148;
  int local_120;
  allocator local_119;
  string local_118 [32];
  LocationInfo local_f8;
  allocator local_b9;
  string local_b8 [32];
  LocationInfo local_98;
  int local_6c [3];
  int local_60;
  int cmd;
  int n;
  rounded_rectangle r;
  real_t y;
  real_t x;
  RoundedRectangleTests *this_local;
  
  rounded_rectangle::rounded_rectangle((rounded_rectangle *)&cmd,10.0,20.0,30.0,40.0,5.0,0.0);
  local_60 = 0;
  local_6c[1] = 1;
  local_6c[0] = rounded_rectangle::vertex
                          ((rounded_rectangle *)&cmd,(real_t *)&r._state,&r._points[1].y);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_b9);
  ut::LocationInfo::LocationInfo(&local_98,(string *)local_b8,0xab);
  ut::are_equal<agge::path_commands,int>((path_commands *)(local_6c + 1),local_6c,&local_98);
  ut::LocationInfo::~LocationInfo(&local_98);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  while( true ) {
    local_6c[2] = rounded_rectangle::vertex
                            ((rounded_rectangle *)&cmd,(real_t *)&r._state,&r._points[1].y);
    if (local_6c[2] != 2) break;
    local_60 = local_60 + 1;
    local_6c[2] = 2;
  }
  value = 10 < local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_118,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_119);
  ut::LocationInfo::LocationInfo(&local_f8,(string *)local_118,0xb0);
  ut::is_true(value,&local_f8);
  ut::LocationInfo::~LocationInfo(&local_f8);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  local_120 = 0x30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_168,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_169);
  ut::LocationInfo::LocationInfo(&local_148,(string *)local_168,0xb1);
  ut::are_equal<int,int>(&local_120,local_6c + 2,&local_148);
  ut::LocationInfo::~LocationInfo(&local_148);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  local_174[1] = 0;
  local_174[0] = rounded_rectangle::vertex
                           ((rounded_rectangle *)&cmd,(real_t *)&r._state,&r._points[1].y);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1c0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_1c1);
  ut::LocationInfo::LocationInfo(&local_1a0,(string *)local_1c0,0xb2);
  ut::are_equal<agge::path_commands,int>((path_commands *)(local_174 + 1),local_174,&local_1a0);
  ut::LocationInfo::~LocationInfo(&local_1a0);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  local_1cc[1] = 0;
  local_1cc[0] = rounded_rectangle::vertex
                           ((rounded_rectangle *)&cmd,(real_t *)&r._state,&r._points[1].y);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_218,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_219);
  ut::LocationInfo::LocationInfo(&local_1f8,(string *)local_218,0xb3);
  ut::are_equal<agge::path_commands,int>((path_commands *)(local_1cc + 1),local_1cc,&local_1f8);
  ut::LocationInfo::~LocationInfo(&local_1f8);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  return;
}

Assistant:

test( AllowsIteration )
			{
				// INIT
				real_t x, y;

				// INIT / ACT
				rounded_rectangle r(10.0f, 20.0f, 30.0f, 40.0f, 5.0f);

				// ACT / ASSERT
				int n = 0;
				int cmd;

				assert_equal(path_command_move_to, r.vertex(&x, &y));

				for (; path_command_line_to == (cmd = r.vertex(&x, &y)); ++n)
				{	}
				
				assert_is_true(n >= 11);
				assert_equal(path_command_end_poly | path_flag_close, cmd);
				assert_equal(path_command_stop, r.vertex(&x, &y));
				assert_equal(path_command_stop, r.vertex(&x, &y));
			}